

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

VariableIndex __thiscall cnn::ComputationGraph::add_parameters(ComputationGraph *this,Parameters *p)

{
  size_type sVar1;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RSI;
  ParameterNode *in_RDI;
  ParameterNode *new_node;
  VariableIndex *in_stack_00000048;
  VariableIndex *new_node_index;
  Parameters *in_stack_ffffffffffffff98;
  uint uVar2;
  ParameterNode *this_00;
  uint local_1c [7];
  
  this_00 = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(in_RSI);
  local_1c[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)this_00,local_1c);
  operator_new(0x80);
  ParameterNode::ParameterNode(in_RDI,in_stack_ffffffffffffff98);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RDI,
             (value_type *)in_stack_ffffffffffffff98);
  uVar2 = (uint)in_RDI;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::push_back
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)this_00,
             (value_type *)in_RSI);
  set_dim_for_new_node((ComputationGraph *)p,in_stack_00000048);
  return (VariableIndex)uVar2;
}

Assistant:

VariableIndex ComputationGraph::add_parameters(Parameters* p) {
  VariableIndex new_node_index(nodes.size());
  ParameterNode* new_node = new ParameterNode(p);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}